

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

QName * __thiscall
Assimp::CFIReaderImpl::parseQualifiedNameOrIndex3
          (CFIReaderImpl *this,
          vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
          *qNameTable)

{
  byte bVar1;
  pointer pQVar2;
  size_t sVar3;
  long lVar4;
  string *psVar5;
  DeadlyImportError *this_00;
  QName *pQVar6;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  QName result;
  
  bVar1 = *this->dataP;
  if ((~bVar1 & 0x3c) == 0) {
    this->dataP = this->dataP + 1;
    result.prefix._M_dataplus._M_p = (pointer)&result.prefix.field_2;
    result.prefix._M_string_length = 0;
    result.prefix.field_2._M_local_buf[0] = '\0';
    result.uri._M_dataplus._M_p = (pointer)&result.uri.field_2;
    result.uri._M_string_length = 0;
    result.uri.field_2._M_local_buf[0] = '\0';
    result.name._M_dataplus._M_p = (pointer)&result.name.field_2;
    result.name._M_string_length = 0;
    result.name.field_2._M_local_buf[0] = '\0';
    if ((bVar1 & 2) == 0) {
      local_98 = 0;
      local_90[0] = 0;
      local_a0 = local_90;
    }
    else {
      psVar5 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).prefixTable);
      std::__cxx11::string::string((string *)&local_a0,(string *)psVar5);
    }
    std::__cxx11::string::_M_assign((string *)&result);
    std::__cxx11::string::~string((string *)&local_a0);
    if ((bVar1 & 1) == 0) {
      local_98 = 0;
      local_90[0] = 0;
      local_a0 = local_90;
    }
    else {
      psVar5 = parseIdentifyingStringOrIndex(this,&(this->vocabulary).namespaceNameTable);
      std::__cxx11::string::string((string *)&local_a0,(string *)psVar5);
    }
    std::__cxx11::string::_M_assign((string *)&result.uri);
    std::__cxx11::string::~string((string *)&local_a0);
    parseIdentifyingStringOrIndex(this,&(this->vocabulary).localNameTable);
    std::__cxx11::string::_M_assign((string *)&result.name);
    std::vector<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>::
    push_back(qNameTable,&result);
    pQVar6 = (qNameTable->
             super__Vector_base<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1;
    QName::~QName(&result);
  }
  else {
    sVar3 = parseInt3(this);
    pQVar2 = (qNameTable->
             super__Vector_base<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(qNameTable->
                  super__Vector_base<Assimp::CFIReaderImpl::QName,_std::allocator<Assimp::CFIReaderImpl::QName>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pQVar2;
    if ((ulong)(lVar4 / 0x60) <= sVar3) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10,0x60,lVar4 % 0x60);
      DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pQVar6 = pQVar2 + sVar3;
  }
  return pQVar6;
}

Assistant:

const QName &parseQualifiedNameOrIndex3(std::vector<QName> &qNameTable) { // C.18
        uint8_t b = *dataP;
        if ((b & 0x3c) == 0x3c) { // xx1111..
            // We have a literal (C.18.3)
            ++dataP;
            QName result;
            // prefix (C.18.3.1)
            result.prefix = b & 0x02 ? parseIdentifyingStringOrIndex(vocabulary.prefixTable) : std::string();
            // namespace-name (C.18.3.1)
            result.uri = b & 0x01 ? parseIdentifyingStringOrIndex(vocabulary.namespaceNameTable) : std::string();
            // local-name
            result.name = parseIdentifyingStringOrIndex(vocabulary.localNameTable);
            qNameTable.push_back(result);
            return qNameTable.back();
        }
        else {
            // We have an index (C.18.4)
            size_t index = parseInt3();
            if (index >= qNameTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            return qNameTable[index];
        }
    }